

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O1

void __thiscall
directed_flag_complex_computer::directed_flag_complex_computer_t::prepare_next_dimension
          (directed_flag_complex_computer_t *this,int dimension)

{
  pointer pcVar1;
  iterator __position;
  _Elt_pointer puVar2;
  pointer puVar3;
  pointer pcVar4;
  _Map_pointer ppuVar5;
  bool bVar6;
  uint uVar7;
  undefined3 uVar8;
  undefined8 uVar9;
  filtered_directed_graph_t *pfVar10;
  uint uVar11;
  char cVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  ostream *poVar16;
  size_t sVar17;
  entry_t eVar18;
  pointer pfVar19;
  _Map_pointer *pppuVar20;
  logic_error *this_00;
  pointer pcVar21;
  long lVar22;
  ulong uVar23;
  _Elt_pointer peVar24;
  entry_t eVar25;
  undefined1 auVar26 [8];
  char cVar27;
  size_type __n;
  store_coboundaries_in_cache_t *psVar28;
  unsigned_long uVar29;
  uint uVar30;
  ulong uVar31;
  pointer puVar32;
  long lVar33;
  pointer pcVar34;
  pointer pfVar35;
  byte bVar36;
  float f;
  vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
  _cache_next_cells;
  vector<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
  store_coboundaries;
  vector<unsigned_long,_std::allocator<unsigned_long>_> _cache_next_cells_offsets;
  vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
  init_next_cell_cache;
  compressed_sparse_matrix<entry_t> p;
  float local_2cc;
  undefined1 local_2c8 [32];
  vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
  local_2a8;
  const_iterator local_288;
  const_iterator local_268;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_248;
  vector<float,_std::allocator<float>_> *local_240;
  string *local_238;
  undefined1 local_230 [8];
  filtered_directed_graph_t *pfStack_228;
  compressed_sparse_matrix<entry_t> *local_220;
  filtered_directed_graph_t *local_218;
  vector<float,_std::allocator<float>_> *local_210;
  __node_base local_208;
  pointer pfStack_200;
  pointer local_1f8;
  vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
  *local_1f0;
  __node_base_ptr local_1e8;
  _Deque_base<entry_t,_std::allocator<entry_t>_> local_1e0 [2];
  ios_base local_138 [264];
  
  bVar36 = 0;
  if (dimension != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"preparing dimension ",0x14);
    poVar16 = (ostream *)std::ostream::operator<<(&std::cout,dimension);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,": indexing ",0xb);
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,dimension);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"-dimensional cells",0x12);
    poVar16 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\r",1);
    this->current_dimension = dimension;
    uVar13 = dimension + 1;
    local_248 = &this->cell_count;
    cell_hasher_t::dimension = (unsigned_short)uVar13;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (local_248,(long)(dimension + 2));
    pcVar34 = (this->coboundary_matrix).
              super__Vector_base<compressed_sparse_matrix<entry_t>,_std::allocator<compressed_sparse_matrix<entry_t>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pcVar1 = (this->coboundary_matrix).
             super__Vector_base<compressed_sparse_matrix<entry_t>,_std::allocator<compressed_sparse_matrix<entry_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pcVar34 != pcVar1) {
      do {
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque
                  ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_230,
                   &pcVar34->bounds);
        std::deque<entry_t,_std::allocator<entry_t>_>::deque
                  ((deque<entry_t,_std::allocator<entry_t>_> *)local_1e0,&pcVar34->entries);
        compressed_sparse_matrix<entry_t>::clear((compressed_sparse_matrix<entry_t> *)local_230);
        std::_Deque_base<entry_t,_std::allocator<entry_t>_>::~_Deque_base(local_1e0);
        std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                  ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_230);
        pcVar34 = pcVar34 + 1;
      } while (pcVar34 != pcVar1);
    }
    if ((dimension <= (int)(uint)this->max_dimension) && (this->_is_top_dimension == false)) {
      local_238 = &this->cache;
      iVar14 = std::__cxx11::string::compare((char *)local_238);
      if (iVar14 != 0) {
        local_230 = (undefined1  [8])&local_220;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Sorry, caching does not work with coefficients yet.","");
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,(string *)local_230);
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      if (this->filtration_algorithm != (filtration_algorithm_t *)0x0) {
        std::
        vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
        ::vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                  *)local_2c8,this->nb_threads,(allocator_type *)local_230);
        local_230 = (undefined1  [8])0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_288,
                   this->nb_threads,(value_type_conflict3 *)local_230,(allocator_type *)&local_268);
        local_268._M_cur = (_Elt_pointer)0x0;
        local_268._M_first = (_Elt_pointer)0x0;
        local_268._M_last = (_Elt_pointer)0x0;
        if (this->nb_threads != 0) {
          uVar31 = 0;
          do {
            local_230 = (undefined1  [8])(local_2c8._0_8_ + uVar31 * 0x40);
            pfStack_228 = (filtered_directed_graph_t *)CONCAT44(pfStack_228._4_4_,0xffffffff);
            if (local_268._M_first == local_268._M_last) {
              std::
              vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
              ::_M_realloc_insert<directed_flag_complex_computer::add_cell_index_to_cache_t>
                        ((vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                          *)&local_268,(iterator)local_268._M_first,
                         (add_cell_index_to_cache_t *)local_230);
            }
            else {
              *(undefined1 (*) [8])&(local_268._M_first)->index = local_230;
              *(filtered_directed_graph_t **)((long)local_268._M_first + 8) = pfStack_228;
              local_268._M_first = (_Elt_pointer)((long)local_268._M_first + 0x10);
            }
            for (puVar32 = (((directed_graph_t *)local_230)->edges).
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
                puVar32 != (pointer)0x0; puVar32 = *(pointer *)puVar32) {
              if (*(void **)(puVar32 + 8) != (void *)0x0) {
                operator_delete__(*(void **)(puVar32 + 8));
              }
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 < this->nb_threads);
        }
        cell_hasher_t::dimension = (unsigned_short)dimension;
        iVar14 = (*this->filtration_algorithm->_vptr_filtration_algorithm_t[5])();
        if ((char)iVar14 != '\0') {
          directed_flag_complex_t::
          for_each_cell<directed_flag_complex_computer::add_cell_index_to_cache_t>
                    (&this->flag_complex,
                     (vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                      *)&local_268,dimension,-1);
        }
        if (((int)(uint)this->min_dimension <= (int)uVar13) ||
           (iVar14 = (*this->filtration_algorithm->_vptr_filtration_algorithm_t[5])(),
           (char)iVar14 != '\0')) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"preparing dimension ",0x14);
          poVar16 = (ostream *)std::ostream::operator<<(&std::cout,dimension);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16,": computing the filtration of all ",0x22);
          poVar16 = (ostream *)std::ostream::operator<<(poVar16,uVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"-dimensional cells",0x12);
          poVar16 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\r",1);
          local_2a8.
          super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2a8.
          super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2a8.
          super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (this->nb_threads != 0) {
            local_240 = &this->next_filtration;
            lVar33 = 0x20;
            uVar31 = 0;
            eVar25.index = 0;
            eVar25.coefficient = 0;
            eVar25._6_2_ = 0;
            do {
              local_288._M_cur[uVar31] = eVar25;
              iVar14 = (*this->filtration_algorithm->_vptr_filtration_algorithm_t[5])();
              if ((char)iVar14 != '\0') {
                eVar25 = (entry_t)((long)eVar25 +
                                  *(long *)(&(((unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                                                *)local_2c8._0_8_)->_M_h).field_0x0 + lVar33));
              }
              pfStack_228 = this->graph;
              local_218 = (filtered_directed_graph_t *)this->filtration_algorithm;
              local_210 = &pfStack_228->edge_filtration;
              if (dimension != 1) {
                local_210 = local_240;
              }
              local_1e8 = (__node_base_ptr)this->nb_threads;
              local_230._0_4_ = 0xffffffff;
              local_220 = (compressed_sparse_matrix<entry_t> *)0x0;
              local_1f8 = (pointer)0x0;
              local_208._M_nxt = (_Hash_node_base *)0x0;
              pfStack_200 = (pointer)0x0;
              local_1f0 = (vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                           *)local_2c8;
              local_1e0[0]._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)local_288._M_cur;
              std::
              vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
              ::emplace_back<directed_flag_complex_computer::compute_filtration_t>
                        (&local_2a8,(compute_filtration_t *)local_230);
              if ((const_iterator *)local_208._M_nxt != (const_iterator *)0x0) {
                operator_delete(local_208._M_nxt,(long)local_1f8 - (long)local_208._M_nxt);
              }
              uVar31 = uVar31 + 1;
              lVar33 = lVar33 + 0x40;
            } while (uVar31 < this->nb_threads);
          }
          directed_flag_complex_t::
          for_each_cell<directed_flag_complex_computer::compute_filtration_t>
                    (&this->flag_complex,&local_2a8,uVar13,-1);
          sVar17 = this->nb_threads;
          if (sVar17 == 0) {
            __n = 0;
          }
          else {
            __n = 0;
            pcVar21 = local_2a8.
                      super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              __n = __n + (long)pcVar21->current_index + 1;
              pcVar21 = pcVar21 + 1;
              sVar17 = sVar17 - 1;
            } while (sVar17 != 0);
          }
          (local_248->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[(int)uVar13] = __n;
          if (__n == 0) {
            this->_is_top_dimension = true;
          }
          pfVar19 = (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish != pfVar19) {
            (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = pfVar19;
          }
          std::vector<float,_std::allocator<float>_>::reserve(&this->next_filtration,__n);
          if (this->nb_threads != 0) {
            uVar31 = 0;
            do {
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)local_230,
                         &local_2a8.
                          super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar31].next_filtration);
              pfVar10 = pfStack_228;
              for (auVar26 = local_230; auVar26 != (undefined1  [8])pfVar10;
                  auVar26 = (undefined1  [8])
                            &(((filtered_directed_graph_t *)auVar26)->super_directed_graph_t).
                             field_0x4) {
                local_2cc = *(float *)&((filtered_directed_graph_t *)auVar26)->
                                       super_directed_graph_t;
                __position._M_current =
                     (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&this->next_filtration,
                             __position,&local_2cc);
                }
                else {
                  *__position._M_current = local_2cc;
                  (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish = __position._M_current + 1;
                }
              }
              if (local_230 != (undefined1  [8])0x0) {
                operator_delete((void *)local_230,(long)local_220 - (long)local_230);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 < this->nb_threads);
          }
          std::
          vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
          ::~vector(&local_2a8);
        }
        std::
        vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
        ::~vector((vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                   *)&local_268);
        if (local_288._M_cur != (_Elt_pointer)0x0) {
          operator_delete(local_288._M_cur,(long)local_288._M_last - (long)local_288._M_cur);
        }
        std::
        vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
        ::~vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                   *)local_2c8);
      }
      if ((int)(uint)this->min_dimension <= (int)uVar13) {
        cell_hasher_t::dimension = (unsigned_short)uVar13;
        std::
        vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
        ::vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                  *)local_2c8,this->nb_threads,(allocator_type *)local_230);
        local_230 = (undefined1  [8])0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_288,
                   this->nb_threads,(value_type_conflict3 *)local_230,(allocator_type *)&local_268);
        local_268._M_cur = (_Elt_pointer)0x0;
        local_268._M_first = (_Elt_pointer)0x0;
        local_268._M_last = (_Elt_pointer)0x0;
        if (this->nb_threads != 0) {
          uVar31 = 0;
          do {
            local_230 = (undefined1  [8])(local_2c8._0_8_ + uVar31 * 0x40);
            pfStack_228 = (filtered_directed_graph_t *)CONCAT44(pfStack_228._4_4_,0xffffffff);
            if (local_268._M_first == local_268._M_last) {
              std::
              vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
              ::_M_realloc_insert<directed_flag_complex_computer::add_cell_index_to_cache_t>
                        ((vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                          *)&local_268,(iterator)local_268._M_first,
                         (add_cell_index_to_cache_t *)local_230);
            }
            else {
              *(undefined1 (*) [8])&(local_268._M_first)->index = local_230;
              *(filtered_directed_graph_t **)((long)local_268._M_first + 8) = pfStack_228;
              local_268._M_first = (_Elt_pointer)((long)local_268._M_first + 0x10);
            }
            for (pcVar34 = (((vector<compressed_sparse_matrix<entry_t>,_std::allocator<compressed_sparse_matrix<entry_t>_>_>
                              *)((long)local_230 + 0x18))->
                           super__Vector_base<compressed_sparse_matrix<entry_t>,_std::allocator<compressed_sparse_matrix<entry_t>_>_>
                           )._M_impl.super__Vector_impl_data._M_start; pcVar34 != (pointer)0x0;
                pcVar34 = *(pointer *)
                           &(pcVar34->bounds).
                            super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                ) {
              puVar2 = (pcVar34->bounds).
                       super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur;
              if (puVar2 != (_Elt_pointer)0x0) {
                operator_delete__(puVar2);
              }
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 < this->nb_threads);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"preparing dimension ",0x14);
        poVar16 = (ostream *)std::ostream::operator<<(&std::cout,dimension);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,": indexing ",0xb);
        poVar16 = (ostream *)std::ostream::operator<<(poVar16,uVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"-dimensional cells",0x12);
        poVar16 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\r",1);
        if (this->_is_top_dimension == false) {
          directed_flag_complex_t::
          for_each_cell<directed_flag_complex_computer::add_cell_index_to_cache_t>
                    (&this->flag_complex,
                     (vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                      *)&local_268,uVar13,-1);
          if (this->nb_threads == 0) {
            eVar18.index = 0;
            eVar18.coefficient = 0;
            eVar18._6_2_ = 0;
          }
          else {
            peVar24 = local_268._M_cur + 1;
            uVar31 = 0;
            eVar18.index = 0;
            eVar18.coefficient = 0;
            eVar18._6_2_ = 0;
            do {
              local_288._M_cur[uVar31] = eVar18;
              eVar18 = (entry_t)((long)((long)eVar18 + 1U) + (long)peVar24->index);
              uVar31 = uVar31 + 1;
              peVar24 = peVar24 + 2;
            } while (uVar31 < this->nb_threads);
          }
          *(entry_t *)
           ((local_248->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start + uVar13) = eVar18;
          if (eVar18 == (entry_t)0x0) {
            this->_is_top_dimension = true;
          }
        }
        local_2a8.
        super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.
        super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.
        super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (this->nb_threads != 0) {
          lVar33 = 0x50;
          uVar31 = 0;
          do {
            memset((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_230,0,0xa0);
            std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
                      ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_230,0);
            local_1e0[0]._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
            local_1e0[0]._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
            local_1e0[0]._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
            local_1e0[0]._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
            local_1e0[0]._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
            local_1e0[0]._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
            local_1e0[0]._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
            local_1e0[0]._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
            local_1e0[0]._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
            local_1e0[0]._M_impl.super__Deque_impl_data._M_map_size = 0;
            std::_Deque_base<entry_t,_std::allocator<entry_t>_>::_M_initialize_map(local_1e0,0);
            pcVar34 = (this->coboundary_matrix).
                      super__Vector_base<compressed_sparse_matrix<entry_t>,_std::allocator<compressed_sparse_matrix<entry_t>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            std::deque<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign1
                      ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                       ((long)pcVar34 + lVar33 + -0x50),
                       (_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_230);
            std::deque<entry_t,_std::allocator<entry_t>_>::_M_move_assign1
                      ((deque<entry_t,_std::allocator<entry_t>_> *)
                       ((long)&(pcVar34->bounds).
                               super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Deque_impl_data._M_map + lVar33));
            std::_Deque_base<entry_t,_std::allocator<entry_t>_>::~_Deque_base(local_1e0);
            std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                      ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_230);
            uVar31 = uVar31 + 1;
            lVar33 = lVar33 + 0xa0;
          } while (uVar31 < this->nb_threads);
        }
        pfVar19 = (pointer)this->nb_threads;
        if (pfVar19 != (pointer)0x0) {
          lVar33 = 0;
          pfVar35 = (pointer)0x0;
          do {
            local_230 = (undefined1  [8])
                        ((ulong)CONCAT31(local_230._5_3_,pfVar35 == (pointer)0x0) << 0x20);
            pfStack_228 = (filtered_directed_graph_t *)CONCAT44(pfStack_228._4_4_,dimension);
            local_220 = (compressed_sparse_matrix<entry_t> *)
                        ((long)&(((this->coboundary_matrix).
                                  super__Vector_base<compressed_sparse_matrix<entry_t>,_std::allocator<compressed_sparse_matrix<entry_t>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->bounds).
                                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Deque_impl_data._M_map + lVar33);
            local_218 = this->graph;
            local_210 = (vector<float,_std::allocator<float>_> *)local_2c8;
            local_208._M_nxt = (_Hash_node_base *)&local_288;
            pfStack_200 = (pointer)(long)(int)(this->cell_count).
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_start[dimension];
            local_1f8 = pfVar19;
            local_1f0 = (vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                         *)CONCAT62(local_1f0._2_6_,this->modulus);
            if (local_2a8.
                super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_2a8.
                super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
              ::_M_realloc_insert<directed_flag_complex_computer::store_coboundaries_in_cache_t>
                        ((vector<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
                          *)&local_2a8,
                         (iterator)
                         local_2a8.
                         super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (store_coboundaries_in_cache_t *)local_230);
            }
            else {
              psVar28 = (store_coboundaries_in_cache_t *)local_230;
              pcVar21 = local_2a8.
                        super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (lVar22 = 9; lVar22 != 0; lVar22 = lVar22 + -1) {
                bVar6 = psVar28->is_first;
                uVar8 = *(undefined3 *)&psVar28->field_0x5;
                ((store_coboundaries_in_cache_t *)pcVar21)->current_index = psVar28->current_index;
                ((store_coboundaries_in_cache_t *)pcVar21)->is_first = bVar6;
                *(undefined3 *)&((store_coboundaries_in_cache_t *)pcVar21)->field_0x5 = uVar8;
                psVar28 = (store_coboundaries_in_cache_t *)
                          ((long)psVar28 + (ulong)bVar36 * -0x10 + 8);
                pcVar21 = (pointer)((long)pcVar21 + (ulong)bVar36 * -0x10 + 8);
              }
              local_2a8.
              super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)((long)local_2a8.
                                   super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 0x48);
            }
            pfVar35 = (pointer)((long)pfVar35 + 1);
            pfVar19 = (pointer)this->nb_threads;
            lVar33 = lVar33 + 0xa0;
          } while (pfVar35 < pfVar19);
        }
        directed_flag_complex_t::
        for_each_cell<directed_flag_complex_computer::store_coboundaries_in_cache_t>
                  (&this->flag_complex,
                   (vector<directed_flag_complex_computer::store_coboundaries_in_cache_t,_std::allocator<directed_flag_complex_computer::store_coboundaries_in_cache_t>_>
                    *)&local_2a8,dimension,-1);
        if (this->nb_threads == 0) {
          uVar29 = 0;
        }
        else {
          puVar3 = (this->coboundary_matrix_offsets).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pppuVar20 = &(((this->coboundary_matrix).
                         super__Vector_base<compressed_sparse_matrix<entry_t>,_std::allocator<compressed_sparse_matrix<entry_t>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->bounds).
                       super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node;
          uVar31 = 0;
          uVar29 = 0;
          do {
            puVar3[uVar31] = uVar29;
            uVar29 = ((long)((iterator *)(pppuVar20 + -3))->_M_cur - (long)pppuVar20[-2] >> 3) +
                     uVar29 + ((long)pppuVar20[-5] - (long)pppuVar20[-7] >> 3) +
                     ((((ulong)((long)*pppuVar20 - (long)pppuVar20[-4]) >> 3) - 1) +
                     (ulong)(*pppuVar20 == (_Map_pointer)0x0)) * 0x40;
            uVar31 = uVar31 + 1;
            pppuVar20 = pppuVar20 + 0x14;
          } while (uVar31 < this->nb_threads);
        }
        (local_248->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[dimension] = uVar29;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"preparing dimension ",0x14);
        poVar16 = (ostream *)std::ostream::operator<<(&std::cout,dimension);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,": done computing coboundaries, now reducing memory consumption",0x3e);
        poVar16 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\r",1);
        if (local_2a8.
            super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2a8.
                          super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_2a8.
                                super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2a8.
                                super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
        ::~vector((vector<directed_flag_complex_computer::add_cell_index_to_cache_t,_std::allocator<directed_flag_complex_computer::add_cell_index_to_cache_t>_>
                   *)&local_268);
        if (local_288._M_cur != (_Elt_pointer)0x0) {
          operator_delete(local_288._M_cur,(long)local_288._M_last - (long)local_288._M_cur);
        }
        std::
        vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
        ::~vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                   *)local_2c8);
        iVar14 = std::__cxx11::string::compare((char *)local_238);
        uVar9 = __filebuf;
        if (iVar14 != 0) {
          if (this->nb_threads != 0) {
            local_240 = _VTT;
            uVar31 = 0;
            do {
              local_2c8._0_8_ = local_2c8 + 0x10;
              pcVar4 = (this->cache)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_2c8,pcVar4,pcVar4 + (this->cache)._M_string_length);
              std::__cxx11::string::append((char *)local_2c8);
              uVar13 = this->current_dimension;
              uVar7 = -uVar13;
              if (0 < (int)uVar13) {
                uVar7 = uVar13;
              }
              uVar30 = 1;
              if (9 < uVar7) {
                uVar23 = (ulong)uVar7;
                uVar11 = 4;
                do {
                  uVar30 = uVar11;
                  uVar15 = (uint)uVar23;
                  if (uVar15 < 100) {
                    uVar30 = uVar30 - 2;
                    goto LAB_00121411;
                  }
                  if (uVar15 < 1000) {
                    uVar30 = uVar30 - 1;
                    goto LAB_00121411;
                  }
                  if (uVar15 < 10000) goto LAB_00121411;
                  uVar23 = uVar23 / 10000;
                  uVar11 = uVar30 + 4;
                } while (99999 < uVar15);
                uVar30 = uVar30 + 1;
              }
LAB_00121411:
              local_230 = (undefined1  [8])&local_220;
              std::__cxx11::string::_M_construct
                        ((ulong)local_230,(char)uVar30 - (char)((int)uVar13 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)((long)&(((unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                                            *)local_230)->_M_h).field_0x0 + (ulong)(uVar13 >> 0x1f))
                         ,uVar30,uVar7);
              std::__cxx11::string::_M_append(local_2c8,(ulong)local_230);
              if (local_230 != (undefined1  [8])&local_220) {
                operator_delete((void *)local_230,
                                (ulong)((long)&(local_220->bounds).
                                               super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Deque_impl_data._M_map + 1));
              }
              std::__cxx11::string::append(local_2c8);
              cVar27 = '\x01';
              if (9 < uVar31) {
                uVar23 = uVar31;
                cVar12 = '\x04';
                do {
                  cVar27 = cVar12;
                  if (uVar23 < 100) {
                    cVar27 = cVar27 + -2;
                    goto LAB_001214fb;
                  }
                  if (uVar23 < 1000) {
                    cVar27 = cVar27 + -1;
                    goto LAB_001214fb;
                  }
                  if (uVar23 < 10000) goto LAB_001214fb;
                  bVar6 = 99999 < uVar23;
                  uVar23 = uVar23 / 10000;
                  cVar12 = cVar27 + '\x04';
                } while (bVar6);
                cVar27 = cVar27 + '\x01';
              }
LAB_001214fb:
              local_230 = (undefined1  [8])&local_220;
              std::__cxx11::string::_M_construct((ulong)local_230,cVar27);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        ((char *)local_230,(uint)pfStack_228,uVar31);
              std::__cxx11::string::_M_append(local_2c8,(ulong)local_230);
              if (local_230 != (undefined1  [8])&local_220) {
                operator_delete((void *)local_230,
                                (ulong)((long)&(local_220->bounds).
                                               super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Deque_impl_data._M_map + 1));
              }
              std::ofstream::ofstream(local_230,(char *)local_2c8._0_8_,_S_bin);
              local_2cc = -NAN;
              std::ostream::write(local_230,
                                  (long)((this->cell_count).
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                        (long)this->current_dimension + 1));
              std::ostream::write(local_230,
                                  (long)((this->coboundary_matrix_offsets).
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar31));
              pcVar34 = (this->coboundary_matrix).
                        super__Vector_base<compressed_sparse_matrix<entry_t>,_std::allocator<compressed_sparse_matrix<entry_t>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppuVar5 = pcVar34[uVar31].bounds.
                        super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_node;
              local_2a8.
              super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)(((long)pcVar34[uVar31].bounds.
                                    super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_last -
                              (long)pcVar34[uVar31].bounds.
                                    super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                             ((long)pcVar34[uVar31].bounds.
                                    super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                              (long)pcVar34[uVar31].bounds.
                                    super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                            ((((ulong)((long)ppuVar5 -
                                      (long)pcVar34[uVar31].bounds.
                                            super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3)
                             - 1) + (ulong)(ppuVar5 == (_Map_pointer)0x0)) * 0x40);
              std::ostream::write(local_230,(long)&local_2a8);
              if (local_2a8.
                  super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                pcVar21 = (pointer)0x0;
                do {
                  std::ostream::write(local_230,(long)&local_2cc);
                  compressed_sparse_matrix<entry_t>::cbegin
                            (&local_288,
                             (this->coboundary_matrix).
                             super__Vector_base<compressed_sparse_matrix<entry_t>,_std::allocator<compressed_sparse_matrix<entry_t>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar31,(size_t)pcVar21);
                  pcVar34 = (this->coboundary_matrix).
                            super__Vector_base<compressed_sparse_matrix<entry_t>,_std::allocator<compressed_sparse_matrix<entry_t>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  while (compressed_sparse_matrix<entry_t>::cend
                                   (&local_268,pcVar34 + uVar31,(size_t)pcVar21),
                        local_288._M_cur != local_268._M_cur) {
                    std::ostream::write(local_230,(long)local_288._M_cur);
                    local_288._M_cur = local_288._M_cur + 1;
                    if (local_288._M_cur == local_288._M_last) {
                      local_288._M_cur = local_288._M_node[1];
                      local_288._M_last = local_288._M_cur + 0x40;
                      local_288._M_first = local_288._M_cur;
                      local_288._M_node = local_288._M_node + 1;
                    }
                    pcVar34 = (this->coboundary_matrix).
                              super__Vector_base<compressed_sparse_matrix<entry_t>,_std::allocator<compressed_sparse_matrix<entry_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  }
                  pcVar21 = (pointer)((long)&pcVar21->current_index + 1);
                } while (pcVar21 < local_2a8.
                                   super__Vector_base<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
              }
              std::ofstream::close();
              local_230 = (undefined1  [8])local_240;
              *(undefined8 *)(local_230 + *(long *)(local_240 + -1)) = uVar9;
              std::filebuf::~filebuf((filebuf *)&pfStack_228);
              std::ios_base::~ios_base(local_138);
              if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
                operator_delete((void *)local_2c8._0_8_,
                                (ulong)&(((unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                                           *)local_2c8._16_8_)->_M_h).field_0x1);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 < this->nb_threads);
          }
          pcVar4 = (this->cache)._M_dataplus._M_p;
          local_2c8._0_8_ = (pointer)(local_2c8 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2c8,pcVar4,pcVar4 + (this->cache)._M_string_length);
          std::__cxx11::string::append((char *)local_2c8);
          uVar13 = this->current_dimension;
          uVar7 = -uVar13;
          if (0 < (int)uVar13) {
            uVar7 = uVar13;
          }
          uVar30 = 1;
          if (9 < uVar7) {
            uVar31 = (ulong)uVar7;
            uVar11 = 4;
            do {
              uVar30 = uVar11;
              uVar15 = (uint)uVar31;
              if (uVar15 < 100) {
                uVar30 = uVar30 - 2;
                goto LAB_001217f6;
              }
              if (uVar15 < 1000) {
                uVar30 = uVar30 - 1;
                goto LAB_001217f6;
              }
              if (uVar15 < 10000) goto LAB_001217f6;
              uVar31 = uVar31 / 10000;
              uVar11 = uVar30 + 4;
            } while (99999 < uVar15);
            uVar30 = uVar30 + 1;
          }
LAB_001217f6:
          local_230 = (undefined1  [8])&local_220;
          std::__cxx11::string::_M_construct
                    ((ulong)local_230,(char)uVar30 - (char)((int)uVar13 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((long)&(((unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                                        *)local_230)->_M_h).field_0x0 + (ulong)(uVar13 >> 0x1f)),
                     uVar30,uVar7);
          std::__cxx11::string::_M_append(local_2c8,(ulong)local_230);
          if (local_230 != (undefined1  [8])&local_220) {
            operator_delete((void *)local_230,
                            (ulong)((long)&(local_220->bounds).
                                           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Deque_impl_data._M_map + 1));
          }
          std::ofstream::ofstream(local_230,(char *)local_2c8._0_8_,_S_bin);
          pfVar19 = (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pfVar35 = (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (pfVar19 != pfVar35) {
            do {
              local_288._M_cur = (_Elt_pointer)CONCAT44(local_288._M_cur._4_4_,*pfVar19);
              std::ostream::write(local_230,(long)&local_288);
              pfVar19 = pfVar19 + 1;
            } while (pfVar19 != pfVar35);
          }
          std::ofstream::close();
          local_230 = (undefined1  [8])_VTT;
          *(undefined8 *)(local_230 + *(long *)(_VTT + -1)) = __filebuf;
          std::filebuf::~filebuf((filebuf *)&pfStack_228);
          std::ios_base::~ios_base(local_138);
          if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
            operator_delete((void *)local_2c8._0_8_,
                            (ulong)&(((unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                                       *)local_2c8._16_8_)->_M_h).field_0x1);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void directed_flag_complex_computer_t::prepare_next_dimension(int dimension) {
	if (dimension == 0) return;

#ifdef INDICATE_PROGRESS
	std::cout << "\033[K"
	          << "preparing dimension " << dimension << ": indexing " << (dimension) << "-dimensional cells"
	          << std::flush << "\r";
#endif

	assert(dimension == current_dimension + 1);
	current_dimension = dimension;
	cell_hasher_t::set_current_cell_dimension(dimension + 1);
	cell_count.resize(dimension + 2);

	// Clean up
	for (auto p : coboundary_matrix) { p.clear(); }

	if (dimension > max_dimension || _is_top_dimension) return;

	if (cache != "") {
#ifdef USE_COEFFICIENTS
		// TODO: Make this work
		std::string err_msg = "Sorry, caching does not work with coefficients yet.";
		throw std::logic_error(err_msg);
#endif
		bool loaded_from_file = false;
		for (size_t i = 0; i < nb_threads; i++) {
			coboundary_matrix[i].clear();
			std::string fname = cache;
			fname += "/matrix_";
			fname += std::to_string(current_dimension);
			fname += "_";
			fname += std::to_string(i);
			std::ifstream f(fname.c_str(), std::ios::binary);
			if (i == 0 && !f.good()) break;
			loaded_from_file = true;

			f.read((char*)&(cell_count[current_dimension + 1]), sizeof(size_t));
			f.read((char*)&(coboundary_matrix_offsets[i]), sizeof(size_t));

			size_t this_size;
			f.read((char*)&(this_size), sizeof(size_t));

			index_t next_value;
			while (this_size > 0 && f.read((char*)&next_value, sizeof(index_t))) {
				if (next_value == -1)
					coboundary_matrix[i].append_column();
				else
					coboundary_matrix[i].push_back(next_value);
			}
			f.close();
		}

		std::string fname = cache;
		fname += "/filtration_";
		fname += std::to_string(current_dimension);
		std::ifstream f(fname.c_str(), std::ios::binary);
		next_filtration.clear();
		value_t next_value;
		while (f.read((char*)&next_value, sizeof(value_t))) next_filtration.push_back(next_value);
		f.close();

		if (loaded_from_file) {
			_is_top_dimension = cell_count[current_dimension + 1] == 0;
			return;
		}
	}

	{
		if (filtration_algorithm != nullptr) {
			// Add the current and next cells into the hash and compute the new
			// filtration
			std::vector<cell_hash_map_t> _cache_current_cells(nb_threads);
			std::vector<size_t> _cache_current_cells_offsets(nb_threads, 0);
			std::vector<add_cell_index_to_cache_t> init_current_cell_cache;
			for (size_t i = 0; i < nb_threads; i++) {
				init_current_cell_cache.push_back(add_cell_index_to_cache_t(_cache_current_cells[i]));
			}

			cell_hasher_t::set_current_cell_dimension(dimension);

			// Add the current cells into the cache if the filtration algorithm
			// needs them
			if (filtration_algorithm->needs_face_filtration())
				flag_complex.for_each_cell(init_current_cell_cache, dimension);

			// If we will actually compute coboundaries, then compute the
			// filtration. Also if we need the face filtrations.
			if (dimension + 1 >= min_dimension || filtration_algorithm->needs_face_filtration()) {
#ifdef INDICATE_PROGRESS
				std::cout << "\033[K"
				          << "preparing dimension " << dimension << ": computing the filtration of all "
				          << (dimension + 1) << "-dimensional cells" << std::flush << "\r";
#endif
				size_t offset = 0;
				std::vector<compute_filtration_t> compute_filtration;
				for (size_t i = 0; i < nb_threads; i++) {
					_cache_current_cells_offsets[i] = offset;
					if (filtration_algorithm->needs_face_filtration()) { offset += _cache_current_cells[i].size(); }
					compute_filtration.push_back(compute_filtration_t(
					    filtration_algorithm, graph, dimension == 1 ? graph.edge_filtration : next_filtration,
					    _cache_current_cells, nb_threads, _cache_current_cells_offsets.data()));
				}
				flag_complex.for_each_cell(compute_filtration, dimension + 1);

				size_t _cell_count = 0;
				for (size_t i = 0; i < nb_threads; i++) _cell_count += compute_filtration[i].number_of_cells();
				cell_count[dimension + 1] = _cell_count;
				if (_cell_count == 0) _is_top_dimension = true;

				// Combine the filtration
				next_filtration.clear();
				next_filtration.reserve(_cell_count);
				for (size_t i = 0; i < nb_threads; i++) {
					for (auto f : compute_filtration[i].filtration()) next_filtration.push_back(f);
				}
			}
		}

		// If we do not want the homology in the next degree, then we can stop
		// here
		if (dimension + 1 < min_dimension) return;

		cell_hasher_t::set_current_cell_dimension(dimension + 1);

		std::vector<cell_hash_map_t> _cache_next_cells(nb_threads);
		std::vector<size_t> _cache_next_cells_offsets(nb_threads, 0);
		std::vector<add_cell_index_to_cache_t> init_next_cell_cache;
		for (size_t i = 0; i < nb_threads; i++) {
			init_next_cell_cache.push_back(add_cell_index_to_cache_t(_cache_next_cells[i]));
		}
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "preparing dimension " << dimension << ": indexing " << (dimension + 1) << "-dimensional cells"
		          << std::flush << "\r";
#endif

		size_t _cell_count = 0;

		if (!is_top_dimension()) {
			flag_complex.for_each_cell(init_next_cell_cache, dimension + 1);

			for (size_t i = 0; i < nb_threads; i++) {
				_cache_next_cells_offsets[i] = _cell_count;
				_cell_count += init_next_cell_cache[i].number_of_cells();
			}
			cell_count[dimension + 1] = _cell_count;
			if (_cell_count == 0) _is_top_dimension = true;
		}

		// Now compute the coboundaries
		std::vector<store_coboundaries_in_cache_t> store_coboundaries;
		for (size_t i = 0; i < nb_threads; i++) coboundary_matrix[i] = compressed_sparse_matrix<entry_t>();
		for (size_t i = 0; i < nb_threads; i++) {
			store_coboundaries.push_back(store_coboundaries_in_cache_t(
			    coboundary_matrix[i], dimension, graph, _cache_next_cells, _cache_next_cells_offsets,
			    int(cell_count[dimension]), i == 0, nb_threads, modulus));
		}
		flag_complex.for_each_cell(store_coboundaries, dimension);

		_cell_count = 0;
		for (size_t i = 0; i < nb_threads; i++) {
			coboundary_matrix_offsets[i] = _cell_count;
			_cell_count += coboundary_matrix[i].size();
		}
		cell_count[dimension] = _cell_count;

#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "preparing dimension " << dimension
		          << ": done computing coboundaries, now reducing memory consumption" << std::flush << "\r";
#endif
	}

	if (cache != "") {
		for (size_t i = 0; i < nb_threads; i++) {
			std::string fname = cache;
			fname += "/matrix_";
			fname += std::to_string(current_dimension);
			fname += "_";
			fname += std::to_string(i);
			std::ofstream o(fname.c_str(), std::ios::binary);
			index_t separator = -1;
			o.write((char*)&(cell_count[current_dimension + 1]), sizeof(size_t));
			o.write((char*)&(coboundary_matrix_offsets[i]), sizeof(size_t));
			size_t this_size = coboundary_matrix[i].size();
			o.write((char*)&this_size, sizeof(size_t));
			for (auto j = 0ul; j < this_size; j++) {
				o.write((char*)&(separator), sizeof(index_t));
				for (auto it = coboundary_matrix[i].cbegin(j); it != coboundary_matrix[i].cend(j); ++it) {
					o.write((char*)&(*it), sizeof(index_t));
				}
			}
			o.close();
		}

		std::string fname = cache;
		fname += "/filtration_";
		fname += std::to_string(current_dimension);
		std::ofstream o(fname.c_str(), std::ios::binary);
		for (auto f : next_filtration) o.write((char*)&f, sizeof(value_t));
		o.close();
	}
}